

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

CTcMacroRsc * __thiscall CTcTokenizer::alloc_macro_rsc(CTcTokenizer *this)

{
  CTcMacroRsc *pCVar1;
  
  pCVar1 = this->macro_res_avail_;
  if (pCVar1 == (CTcMacroRsc *)0x0) {
    pCVar1 = (CTcMacroRsc *)operator_new(0x70);
    (pCVar1->line_exp_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00367838;
    (pCVar1->line_exp_).buf_ = (char *)0x0;
    (pCVar1->line_exp_).buf_size_ = 0;
    (pCVar1->line_exp_).buf_len_ = 0;
    (pCVar1->macro_exp_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00367838;
    (pCVar1->macro_exp_).buf_ = (char *)0x0;
    (pCVar1->macro_exp_).buf_size_ = 0;
    (pCVar1->macro_exp_).buf_len_ = 0;
    (pCVar1->actual_exp_buf_)._vptr_CTcTokString = (_func_int **)&PTR__CTcTokString_00367838;
    (pCVar1->actual_exp_buf_).buf_ = (char *)0x0;
    (pCVar1->actual_exp_buf_).buf_size_ = 0;
    (pCVar1->actual_exp_buf_).buf_len_ = 0;
    pCVar1->next_avail_ = (CTcMacroRsc *)0x0;
    pCVar1->next_ = (CTcMacroRsc *)0x0;
    pCVar1->next_ = this->macro_res_head_;
    this->macro_res_head_ = pCVar1;
  }
  else {
    this->macro_res_avail_ = pCVar1->next_avail_;
  }
  return pCVar1;
}

Assistant:

CTcMacroRsc *CTcTokenizer::alloc_macro_rsc()
{
    CTcMacroRsc *rsc;
    
    /* 
     *   if there's anything in the available list, take the first item
     *   off the list and return it 
     */
    if (macro_res_avail_ != 0)
    {
        /* remember the item to return */
        rsc = macro_res_avail_;

        /* remove it from the list */
        macro_res_avail_ = macro_res_avail_->next_avail_;

        /* return it */
        return rsc;
    }

    /* there's nothing on the available list - allocate a new item */
    rsc = new CTcMacroRsc();

    /* if that failed, return failure */
    if (rsc == 0)
    {
        log_error(TCERR_OUT_OF_MEM_MAC_EXP);
        return 0;
    }

    /* add it onto the master list */
    rsc->next_ = macro_res_head_;
    macro_res_head_ = rsc;

    /* return it */
    return rsc;
}